

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O1

void __thiscall RM_FileScan::~RM_FileScan(RM_FileScan *this)

{
  if (((this->scanEnded == false) && (this->hasPagePinned == true)) && (this->openScan == true)) {
    PF_FileHandle::UnpinPage(&this->fileHandle->pfh,this->scanPage);
  }
  if (this->initializedValue == true) {
    free(this->value);
    this->initializedValue = false;
  }
  PF_PageHandle::~PF_PageHandle(&this->currentPH);
  return;
}

Assistant:

RM_FileScan::~RM_FileScan(){
  if(scanEnded == false && hasPagePinned == true && openScan == true){
    fileHandle->pfh.UnpinPage(scanPage);
  }
  if (initializedValue == true){ // free any memory not freed
    free(value);
    initializedValue = false;
  }
}